

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
llvm::SmallVectorTemplateBase<llbuild::buildsystem::BuildKey,_false>::push_back
          (SmallVectorTemplateBase<llbuild::buildsystem::BuildKey,_false> *this,BuildKey *Elt)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long *plVar2;
  void *pvVar3;
  pointer pcVar4;
  undefined8 uVar5;
  uint uVar6;
  undefined8 *puVar7;
  
  uVar6 = (this->super_SmallVectorTemplateCommon<llbuild::buildsystem::BuildKey,_void>).
          super_SmallVectorBase.Size;
  if ((this->super_SmallVectorTemplateCommon<llbuild::buildsystem::BuildKey,_void>).
      super_SmallVectorBase.Capacity <= uVar6) {
    grow(this,0);
    uVar6 = (this->super_SmallVectorTemplateCommon<llbuild::buildsystem::BuildKey,_void>).
            super_SmallVectorBase.Size;
  }
  pvVar3 = (this->super_SmallVectorTemplateCommon<llbuild::buildsystem::BuildKey,_void>).
           super_SmallVectorBase.BeginX;
  plVar2 = (long *)((long)pvVar3 + (ulong)uVar6 * 0x20);
  puVar7 = (undefined8 *)((ulong)uVar6 * 0x20 + (long)pvVar3);
  *puVar7 = puVar7 + 2;
  pcVar4 = (Elt->key).key._M_dataplus._M_p;
  paVar1 = &(Elt->key).key.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 == paVar1) {
    uVar5 = *(undefined8 *)((long)&(Elt->key).key.field_2 + 8);
    puVar7[2] = paVar1->_M_allocated_capacity;
    puVar7[3] = uVar5;
  }
  else {
    *plVar2 = (long)pcVar4;
    plVar2[2] = paVar1->_M_allocated_capacity;
  }
  plVar2[1] = (Elt->key).key._M_string_length;
  (Elt->key).key._M_dataplus._M_p = (pointer)paVar1;
  (Elt->key).key._M_string_length = 0;
  (Elt->key).key.field_2._M_local_buf[0] = '\0';
  uVar6 = (this->super_SmallVectorTemplateCommon<llbuild::buildsystem::BuildKey,_void>).
          super_SmallVectorBase.Size;
  if (uVar6 < (this->super_SmallVectorTemplateCommon<llbuild::buildsystem::BuildKey,_void>).
              super_SmallVectorBase.Capacity) {
    (this->super_SmallVectorTemplateCommon<llbuild::buildsystem::BuildKey,_void>).
    super_SmallVectorBase.Size = uVar6 + 1;
    return;
  }
  __assert_fail("Size <= capacity()",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                ,0x44,"void llvm::SmallVectorBase::set_size(size_t)");
}

Assistant:

void push_back(T &&Elt) {
    if (LLVM_UNLIKELY(this->size() >= this->capacity()))
      this->grow();
    ::new ((void*) this->end()) T(::std::move(Elt));
    this->set_size(this->size() + 1);
  }